

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

OLECHAR __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PeekNextChar(Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  OLECHAR OVar1;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  OVar1 = UTF8EncodingPolicyBase<false>::PeekFull
                    (&this->super_UTF8EncodingPolicyBase<false>,this->m_currentCharacter,
                     this->m_pchLast);
  return OVar1;
}

Assistant:

OLECHAR PeekNextChar(void)
    {
        return this->PeekFull(m_currentCharacter, m_pchLast);
    }